

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O0

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)

{
  SQRegFunction *f;
  SQInteger i;
  HSQUIRRELVM v_local;
  
  sq_pushstring(v,"regexp",-1);
  sq_newclass(v,0);
  for (f = (SQRegFunction *)0x0; rexobj_funcs[(long)f].name != (SQChar *)0x0;
      f = (SQRegFunction *)((long)&f->name + 1)) {
    sq_pushstring(v,rexobj_funcs[(long)f].name,-1);
    sq_newclosure(v,rexobj_funcs[(long)f].f,0);
    sq_setparamscheck(v,rexobj_funcs[(long)f].nparamscheck,rexobj_funcs[(long)f].typemask);
    sq_setnativeclosurename(v,-1,rexobj_funcs[(long)f].name);
    sq_newslot(v,-3,0);
  }
  sq_newslot(v,-3,0);
  for (f = (SQRegFunction *)0x0; stringlib_funcs[(long)f].name != (SQChar *)0x0;
      f = (SQRegFunction *)((long)&f->name + 1)) {
    sq_pushstring(v,stringlib_funcs[(long)f].name,-1);
    sq_newclosure(v,stringlib_funcs[(long)f].f,0);
    sq_setparamscheck(v,stringlib_funcs[(long)f].nparamscheck,stringlib_funcs[(long)f].typemask);
    sq_setnativeclosurename(v,-1,stringlib_funcs[(long)f].name);
    sq_newslot(v,-3,0);
  }
  return 1;
}

Assistant:

SQInteger sqstd_register_stringlib(HSQUIRRELVM v)
{
    sq_pushstring(v,_SC("regexp"),-1);
    sq_newclass(v,SQFalse);
    SQInteger i = 0;
    while(rexobj_funcs[i].name != 0) {
        const SQRegFunction &f = rexobj_funcs[i];
        sq_pushstring(v,f.name,-1);
        sq_newclosure(v,f.f,0);
        sq_setparamscheck(v,f.nparamscheck,f.typemask);
        sq_setnativeclosurename(v,-1,f.name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    sq_newslot(v,-3,SQFalse);

    i = 0;
    while(stringlib_funcs[i].name!=0)
    {
        sq_pushstring(v,stringlib_funcs[i].name,-1);
        sq_newclosure(v,stringlib_funcs[i].f,0);
        sq_setparamscheck(v,stringlib_funcs[i].nparamscheck,stringlib_funcs[i].typemask);
        sq_setnativeclosurename(v,-1,stringlib_funcs[i].name);
        sq_newslot(v,-3,SQFalse);
        i++;
    }
    return 1;
}